

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

size_t nghttp2_bufs_remove_copy(nghttp2_bufs *bufs,uint8_t *out)

{
  size_t sVar1;
  
  sVar1 = nghttp2_bufs_len(bufs);
  while (bufs = (nghttp2_bufs *)bufs->head, bufs != (nghttp2_bufs *)0x0) {
    out = nghttp2_cpymem(out,(uint8_t *)bufs->chunk_length,
                         (long)bufs->max_chunk - (long)bufs->chunk_length);
  }
  return sVar1;
}

Assistant:

size_t nghttp2_bufs_remove_copy(nghttp2_bufs *bufs, uint8_t *out) {
  size_t len;
  nghttp2_buf_chain *chain;
  nghttp2_buf *buf;
  nghttp2_buf resbuf;

  len = nghttp2_bufs_len(bufs);

  nghttp2_buf_wrap_init(&resbuf, out, len);

  for (chain = bufs->head; chain; chain = chain->next) {
    buf = &chain->buf;
    resbuf.last = nghttp2_cpymem(resbuf.last, buf->pos, nghttp2_buf_len(buf));
  }

  return len;
}